

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_7c237::testRSMatrix(M44f *M,V3f *t,V3f *r,V3f *s)

{
  Vec3<float> *in_RCX;
  M44f *in_RDX;
  Vec3<float> *in_RSI;
  M44f N;
  Matrix44<float> local_60;
  Vec3<float> *local_20;
  
  local_20 = in_RCX;
  Imath_3_2::Matrix44<float>::Matrix44(&local_60);
  Imath_3_2::Matrix44<float>::makeIdentity(&local_60);
  Imath_3_2::Matrix44<float>::translate<float>(&local_60,in_RSI);
  Imath_3_2::Matrix44<float>::rotate<float>
            ((Matrix44<float> *)N.x[1]._8_8_,(Vec3<float> *)N.x[1]._0_8_);
  Imath_3_2::Matrix44<float>::scale<float>(&local_60,local_20);
  compareMat((M44f *)in_RSI,in_RDX);
  return;
}

Assistant:

void
testRSMatrix (M44f& M, V3f& t, V3f& r, V3f& s)
{
    M44f N;
    N.makeIdentity ();
    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.scale (s);

    compareMat (M, N);
}